

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

void duckdb::WriteCSVFlushBatch
               (ClientContext *context,FunctionData *bind_data,GlobalFunctionData *gstate,
               PreparedBatchData *batch)

{
  MemoryStream *this;
  data_ptr_t data;
  idx_t size;
  
  this = (MemoryStream *)(batch + 1);
  data = MemoryStream::GetData(this);
  size = MemoryStream::GetPosition(this);
  GlobalWriteCSVData::WriteRows((GlobalWriteCSVData *)gstate,data,size,(string *)(bind_data + 0x8d))
  ;
  MemoryStream::Rewind(this);
  return;
}

Assistant:

void WriteCSVFlushBatch(ClientContext &context, FunctionData &bind_data, GlobalFunctionData &gstate,
                        PreparedBatchData &batch) {
	auto &csv_batch = batch.Cast<WriteCSVBatchData>();
	auto &global_state = gstate.Cast<GlobalWriteCSVData>();
	auto &csv_data = bind_data.Cast<WriteCSVData>();
	auto &writer = csv_batch.stream;
	global_state.WriteRows(writer.GetData(), writer.GetPosition(), csv_data.newline);
	writer.Rewind();
}